

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::wait_until_socket_is_ready(socket_t sock,time_t sec,time_t usec)

{
  int iVar1;
  socklen_t local_1c8;
  int local_1c4;
  socklen_t len;
  int error;
  timeval tv;
  fd_set fdse;
  fd_set fdsw;
  fd_set *__arr;
  undefined1 local_a0 [4];
  uint __i;
  fd_set fdsr;
  time_t usec_local;
  time_t sec_local;
  socket_t sock_local;
  
  fdsr.fds_bits[0xf] = usec;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    *(undefined8 *)(local_a0 + (ulong)__arr._4_4_ * 8) = 0;
  }
  *(ulong *)(local_a0 + (long)(sock / 0x40) * 8) =
       1L << ((byte)((long)sock % 0x40) & 0x3f) | *(ulong *)(local_a0 + (long)(sock / 0x40) * 8);
  memcpy(fdse.fds_bits + 0xf,local_a0,0x80);
  memcpy(&tv.tv_usec,local_a0,0x80);
  tv.tv_sec = fdsr.fds_bits[0xf];
  _len = sec;
  iVar1 = select(sock + 1,(fd_set *)local_a0,(fd_set *)(fdse.fds_bits + 0xf),(fd_set *)&tv.tv_usec,
                 (timeval *)&len);
  if ((iVar1 < 1) ||
     (((*(ulong *)(local_a0 + (long)(sock / 0x40) * 8) & 1L << ((byte)((long)sock % 0x40) & 0x3f))
       == 0 && ((fdse.fds_bits[(long)(sock / 0x40) + 0xf] & 1L << ((byte)((long)sock % 0x40) & 0x3f)
                ) == 0)))) {
    sec_local._7_1_ = false;
  }
  else {
    local_1c4 = 0;
    local_1c8 = 4;
    iVar1 = getsockopt(sock,1,4,&local_1c4,&local_1c8);
    sec_local._7_1_ = -1 < iVar1 && local_1c4 == 0;
  }
  return sec_local._7_1_;
}

Assistant:

inline bool wait_until_socket_is_ready(socket_t sock, time_t sec, time_t usec) {
#ifdef CPPHTTPLIB_USE_POLL
  struct pollfd pfd_read;
  pfd_read.fd = sock;
  pfd_read.events = POLLIN | POLLOUT;

  auto timeout = static_cast<int>(sec * 1000 + usec / 1000);

  if (poll(&pfd_read, 1, timeout) > 0 &&
      pfd_read.revents & (POLLIN | POLLOUT)) {
    int error = 0;
    socklen_t len = sizeof(error);
    return getsockopt(sock, SOL_SOCKET, SO_ERROR,
                      reinterpret_cast<char *>(&error), &len) >= 0 &&
           !error;
  }
  return false;
#else
  fd_set fdsr;
  FD_ZERO(&fdsr);
  FD_SET(sock, &fdsr);

  auto fdsw = fdsr;
  auto fdse = fdsr;

  timeval tv;
  tv.tv_sec = static_cast<long>(sec);
  tv.tv_usec = static_cast<long>(usec);

  if (select(static_cast<int>(sock + 1), &fdsr, &fdsw, &fdse, &tv) > 0 &&
      (FD_ISSET(sock, &fdsr) || FD_ISSET(sock, &fdsw))) {
    int error = 0;
    socklen_t len = sizeof(error);
    return getsockopt(sock, SOL_SOCKET, SO_ERROR,
                      reinterpret_cast<char *>(&error), &len) >= 0 &&
           !error;
  }
  return false;
#endif
}